

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O1

void Aig_ObjCutPrint(Aig_ManCut_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Cut_t *pCut;
  
  iVar1 = 0;
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  if (0 < p->nCutsMax) {
    pCut = p->pCuts[pObj->Id];
    do {
      if (pCut->nFanins != '\0') {
        Aig_CutPrint(pCut);
      }
      iVar1 = iVar1 + 1;
      pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
    } while (iVar1 < p->nCutsMax);
  }
  return;
}

Assistant:

void Aig_ObjCutPrint( Aig_ManCut_t * p, Aig_Obj_t * pObj )
{
    Aig_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Aig_ObjForEachCut( p, pObj, pCut, i )
        if ( pCut->nFanins )
            Aig_CutPrint( pCut );
//    printf( "\n" );
}